

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O0

void nhr_request_send_raw_request(nhr_request_conflict r)

{
  nhr_bool nVar1;
  size_t local_20;
  size_t header_size;
  char *header;
  nhr_request_conflict r_local;
  
  header_size = 0;
  local_20 = 0;
  header = (char *)r;
  if (r->method == nhr_method_GET) {
    header_size = (size_t)nhr_request_create_header_GET(r,&local_20);
  }
  else {
    if (r->method != nhr_method_POST) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_request_private.c"
                    ,0x8c,"void nhr_request_send_raw_request(nhr_request)");
    }
    header_size = (size_t)nhr_request_create_header_POST(r,&local_20);
  }
  nVar1 = nhr_request_send_buffer((nhr_request_conflict)header,(void *)header_size,local_20);
  if (nVar1 == '\0') {
    nhr_request_close((nhr_request_conflict)header);
    nVar1 = nhr_request_check_timeout((nhr_request_conflict)header);
    if (nVar1 != '\0') {
      header[0x48] = '\x02';
      header[0x49] = '\0';
      header[0x4a] = '\0';
      header[0x4b] = '\0';
      nhr_request_set_command((nhr_request_conflict)header,6);
    }
  }
  else {
    nhr_request_set_command((nhr_request_conflict)header,3);
  }
  nhr_free((void *)header_size);
  return;
}

Assistant:

void nhr_request_send_raw_request(nhr_request r) {
	char * header = NULL;
	size_t header_size = 0;
	switch (r->method) {
#if !defined(NHR_NO_GET)
		case nhr_method_GET: header = nhr_request_create_header_GET(r, &header_size); break;
#endif

#if !defined(NHR_NO_POST)
		case nhr_method_POST: header = nhr_request_create_header_POST(r, &header_size); break;
#endif

		default:
			assert(0); //TODO: unsupported method
			break;
	}

	if (nhr_request_send_buffer(r, header, header_size)) {
		nhr_request_set_command(r, NHR_COMMAND_START_WAITING_RAW_RESPONSE);
	} else {
		nhr_request_close(r);
		if (nhr_request_check_timeout(r)) {
			r->error_code = nhr_error_code_failed_connect_to_host;
			nhr_request_set_command(r, NHR_COMMAND_INFORM_ERROR);
		}
	}
	nhr_free(header);
}